

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_debug(lua_State *L)

{
  lua_State *plVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  size_t size;
  char local_118 [8];
  char buffer [250];
  lua_State *L_local;
  
  unique0x10000168 = L;
  pvVar3 = ravi_get_debugger_data(L);
  if (pvVar3 == (void *)0x0) {
    while( true ) {
      ravi_writestringerror(stack0xffffffffffffffe8,"%s","lua_debug> ");
      pcVar4 = fgets(local_118,0xfa,_stdin);
      if ((pcVar4 == (char *)0x0) ||
         (iVar2 = strcmp(local_118,"cont\n"), plVar1 = stack0xffffffffffffffe8, iVar2 == 0)) break;
      size = strlen(local_118);
      iVar2 = luaL_loadbufferx(plVar1,local_118,size,"=(debug command)",(char *)0x0);
      if ((iVar2 != 0) ||
         (iVar2 = lua_pcallk(stack0xffffffffffffffe8,0,0,0,0,(lua_KFunction)0x0), iVar2 != 0)) {
        plVar1 = stack0xffffffffffffffe8;
        pcVar4 = lua_tolstring(stack0xffffffffffffffe8,-1,(size_t *)0x0);
        ravi_writestringerror(plVar1,"%s\n",pcVar4);
      }
      lua_settop(stack0xffffffffffffffe8,0);
    }
  }
  return 0;
}

Assistant:

static int db_debug (lua_State *L) {
  /* Ravi change - disallow when debugging via VSCode */
  if (ravi_get_debugger_data(L) != NULL)
    return 0;
  for (;;) {
    char buffer[250];
    lua_writestringerror("%s", "lua_debug> ");
    if (fgets(buffer, sizeof(buffer), stdin) == 0 ||
        strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
        lua_pcall(L, 0, 0, 0))
      lua_writestringerror("%s\n", lua_tostring(L, -1));
    lua_settop(L, 0);  /* remove eventual returns */
  }
}